

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O0

void __thiscall HostVector_copy_constructor_Test::TestBody(HostVector_copy_constructor_Test *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  reference actual;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  int i_1;
  Message local_90;
  pointer local_88;
  pointer local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  HostVector<float> v2;
  int local_34;
  undefined1 local_30 [4];
  int i;
  HostVector<float> v1;
  HostVector_copy_constructor_Test *this_local;
  
  v1._24_8_ = this;
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
                     *)local_30,100);
  for (local_34 = 0;
      sVar2 = memory::
              ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
              ::size((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                      *)local_30), (ulong)(long)local_34 < sVar2; local_34 = local_34 + 1) {
    pvVar3 = memory::
             ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)local_30,(long)local_34);
    *pvVar3 = (float)local_34;
  }
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
              *)&gtest_ar.message_,
             (Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
              *)local_30);
  local_80 = memory::
             ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::data((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)&gtest_ar.message_);
  local_88 = memory::
             ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::data((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)local_30);
  testing::internal::CmpHelperNE<float*,float*>
            ((internal *)local_78,"v2.data()","v1.data()",&local_80,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x4d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff68,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff68);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  for (gtest_ar_1.message_.ptr_._4_4_ = 0; gtest_ar_1.message_.ptr_._4_4_ < 100;
      gtest_ar_1.message_.ptr_._4_4_ = gtest_ar_1.message_.ptr_._4_4_ + 1) {
    pvVar3 = memory::
             ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)local_30,(long)gtest_ar_1.message_.ptr_._4_4_);
    actual = memory::
             ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[]((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           *)&gtest_ar.message_,(long)gtest_ar_1.message_.ptr_._4_4_);
    testing::internal::EqHelper<false>::Compare<float,float>
              ((EqHelper<false> *)local_b0,"v1[i]","v2[i]",pvVar3,actual);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x51,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  }
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array((Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)&gtest_ar.message_);
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array((Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)local_30);
  return;
}

Assistant:

TEST(HostVector, copy_constructor) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // initialize values as monotone sequence
    for(int i=0; i<v1.size(); ++i)
        v1[i] = float(i);

    // copy constructor
    //HostVector<float> v2;
    //v2 = v1;
    HostVector<float> v2 = v1;

    // ensure that new memory was allocated
    EXPECT_NE(v2.data(), v1.data());

    // check that v3 has values originally copied over from v1
    for(int i=0; i<100; i++)
        EXPECT_EQ(v1[i], v2[i]);
}